

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::Executor::Impl::processAsyncCancellations
          (Impl *this,Vector<kj::_::XThreadEvent_*> *eventsToCancelOutsideLock)

{
  Vector<kj::_::XThreadEvent_*> *this_00;
  XThreadEvent **ppXVar1;
  XThreadEvent **event_1;
  XThreadEvent **__end2_1;
  XThreadEvent **__begin2_1;
  Vector<kj::_::XThreadEvent_*> *__range2_1;
  undefined1 local_68 [8];
  Locked<kj::Executor::Impl::State> lock;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_40;
  XThreadEvent **local_38;
  XThreadEvent **event;
  XThreadEvent **__end2;
  XThreadEvent **__begin2;
  Vector<kj::_::XThreadEvent_*> *__range2;
  Vector<kj::_::XThreadEvent_*> *eventsToCancelOutsideLock_local;
  Impl *this_local;
  
  __begin2 = (XThreadEvent **)eventsToCancelOutsideLock;
  __range2 = eventsToCancelOutsideLock;
  eventsToCancelOutsideLock_local = (Vector<kj::_::XThreadEvent_*> *)this;
  __end2 = Vector<kj::_::XThreadEvent_*>::begin(eventsToCancelOutsideLock);
  event = Vector<kj::_::XThreadEvent_*>::end((Vector<kj::_::XThreadEvent_*> *)__begin2);
  for (; __end2 != event; __end2 = __end2 + 1) {
    local_38 = __end2;
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::Maybe();
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::operator=
              (&(*local_38)->promiseNode,&local_40);
    Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Maybe(&local_40);
    kj::_::Event::disarm(&(*local_38)->super_Event);
  }
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)local_68,this);
  this_00 = __range2;
  __end2_1 = Vector<kj::_::XThreadEvent_*>::begin(__range2);
  ppXVar1 = Vector<kj::_::XThreadEvent_*>::end(this_00);
  for (; __end2_1 != ppXVar1; __end2_1 = __end2_1 + 1) {
    kj::_::XThreadEvent::setDoneState(*__end2_1);
  }
  Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_68);
  return;
}

Assistant:

void processAsyncCancellations(Vector<_::XThreadEvent*>& eventsToCancelOutsideLock) {
    // After calling dispatchAll() or dispatchCancels() with the lock held, it may be that some
    // cancellations require dropping the lock before destroying the promiseNode. In that case
    // those cancellations will be added to the eventsToCancelOutsideLock Vector passed to the
    // method. That vector must then be passed to processAsyncCancellations() as soon as the lock
    // is released.

    for (auto& event: eventsToCancelOutsideLock) {
      event->promiseNode = kj::none;
      event->disarm();
    }

    // Now we need to mark all the events "done" under lock.
    auto lock = state.lockExclusive();
    for (auto& event: eventsToCancelOutsideLock) {
      event->setDoneState();
    }
  }